

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void EOPLL_reset(EOPLL *opll)

{
  int local_14;
  int i;
  EOPLL *opll_local;
  
  if (opll != (EOPLL *)0x0) {
    opll->adr = '\0';
    opll->pm_phase = 0;
    opll->am_phase = 0;
    opll->noise = 1;
    opll->rhythm_mode = '\0';
    opll->slot_key_status = 0;
    opll->eg_counter = 0;
    if (opll->chip_type == '\x01') {
      opll->reg[0xe] = ' ';
      update_rhythm_mode(opll);
    }
    reset_rate_conversion_params(opll);
    for (local_14 = 0; local_14 < 0x12; local_14 = local_14 + 1) {
      reset_slot(opll->slot + local_14,local_14);
    }
    for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
      set_patch(opll,local_14,0);
    }
    for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
      EOPLL_writeReg(opll,(uint8_t)local_14,'\0');
    }
    for (local_14 = 0; local_14 < 0xe; local_14 = local_14 + 1) {
      opll->ch_out[local_14] = 0;
    }
  }
  return;
}

Assistant:

void EOPLL_reset(EOPLL *opll) {
  int i;

  if (!opll)
    return;

  opll->adr = 0;

  opll->pm_phase = 0;
  opll->am_phase = 0;

  opll->noise = 0x1;
  //opll->mask = 0;

  opll->rhythm_mode = 0;
  opll->slot_key_status = 0;
  opll->eg_counter = 0;
  if (opll->chip_type == 1)
  {
    opll->reg[0x0e] = 32;
    update_rhythm_mode(opll);
  }

  reset_rate_conversion_params(opll);

  for (i = 0; i < 18; i++)
    reset_slot(&opll->slot[i], i);

  for (i = 0; i < 9; i++) {
    set_patch(opll, i, 0);
  }

  for (i = 0; i < 0x40; i++)
    EOPLL_writeReg(opll, i, 0);

  /*for (i = 0; i < 15; i++) {
    opll->pan[i] = 3;
    Panning_Centre(opll->pan_fine[i]);
  }*/

  for (i = 0; i < 14; i++) {
    opll->ch_out[i] = 0;
  }
}